

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

NodeSequence __thiscall
GraphBuilder::insertPthreadJoin(GraphBuilder *this,CallInst *callInstruction)

{
  Function *pFVar1;
  JoinNode *node;
  NodeSequence NVar2;
  
  pFVar1 = llvm::CallBase::getCalledFunction((CallBase *)callInstruction);
  if (pFVar1 == (Function *)0x0) {
    node = createNode<(NodeType)2,decltype(nullptr),llvm::CallInst_const*>
                     ((void *)0x0,callInstruction);
  }
  else {
    node = createNode<(NodeType)2,llvm::CallInst_const*>(callInstruction);
  }
  NVar2.first = addNode<JoinNode>(this,node);
  NVar2.second = &(NVar2.first)->super_Node;
  return NVar2;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertPthreadJoin(const CallInst *callInstruction) {
    JoinNode *joinNode;
    if (callInstruction->getCalledFunction()) {
        joinNode = addNode(createNode<NodeType::JOIN>(callInstruction));
    } else {
        joinNode =
                addNode(createNode<NodeType::JOIN>(nullptr, callInstruction));
    }
    return {joinNode, joinNode};
}